

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

void wasm::Literal::printDouble(ostream *o,double d)

{
  undefined8 in_RAX;
  size_t sVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uStack_28;
  
  if ((long)d < 0 && d == 0.0) {
    pcVar4 = "-0";
    lVar3 = 2;
LAB_009449bd:
    std::__ostream_insert<char,std::char_traits<char>>(o,pcVar4,lVar3);
    return;
  }
  if (NAN(d)) {
    pcVar4 = "";
    if ((long)d < 0) {
      pcVar4 = "-";
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,pcVar4,(ulong)d >> 0x3f);
    std::__ostream_insert<char,std::char_traits<char>>(o,"nan",3);
    if (((ulong)d & 0xfffffffffffff) == 0) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,":0x",3);
    *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) =
         *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)o);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    return;
  }
  if (0x7fefffffffffffff < (ulong)ABS(d)) {
    pcVar4 = "inf";
    if ((long)d < 0) {
      pcVar4 = "-inf";
    }
    lVar3 = 3 - ((long)d >> 0x3f);
    goto LAB_009449bd;
  }
  uStack_28 = in_RAX;
  pcVar4 = cashew::JSPrinter::numToString(d,true);
  if (*pcVar4 == '-') {
    if (pcVar4[1] != '.') goto LAB_00944a12;
    pcVar4 = pcVar4 + 1;
    pcVar5 = "-0";
    lVar3 = 2;
  }
  else {
    if (*pcVar4 != '.') goto LAB_00944a12;
    pcVar5 = (char *)((long)&uStack_28 + 7);
    uStack_28 = CONCAT17(0x30,(undefined7)uStack_28);
    lVar3 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar5,lVar3);
LAB_00944a12:
  sVar1 = strlen(pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar4,sVar1);
  return;
}

Assistant:

void Literal::printDouble(std::ostream& o, double d) {
  if (d == 0 && std::signbit(d)) {
    o << "-0";
    return;
  }
  if (std::isnan(d)) {
    const char* sign = std::signbit(d) ? "-" : "";
    o << sign << "nan";
    if (uint64_t payload = NaNPayload(d)) {
      o << ":0x" << std::hex << payload << std::dec;
    }
    return;
  }
  if (!std::isfinite(d)) {
    o << (std::signbit(d) ? "-inf" : "inf");
    return;
  }
  const char* text = cashew::JSPrinter::numToString(d);
  // spec interpreter hates floats starting with '.'
  if (text[0] == '.') {
    o << '0';
  } else if (text[0] == '-' && text[1] == '.') {
    o << "-0";
    text++;
  }
  o << text;
}